

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

bool Assimp::Blender::read<Assimp::Blender::MFace>
               (Structure *s,MFace *p,size_t cnt,FileDatabase *db)

{
  undefined1 local_58 [8];
  MFace read;
  size_t i;
  FileDatabase *db_local;
  size_t cnt_local;
  MFace *p_local;
  Structure *s_local;
  
  read.mat_nr = 0;
  read.flag = '\0';
  read._37_3_ = 0;
  cnt_local = (size_t)p;
  for (; (ulong)read._32_8_ < cnt; read._32_8_ = read._32_8_ + 1) {
    MFace::MFace((MFace *)local_58);
    Structure::Convert<Assimp::Blender::MFace>(s,(MFace *)local_58,db);
    MFace::operator=((MFace *)cnt_local,(MFace *)local_58);
    cnt_local = cnt_local + 0x28;
    MFace::~MFace((MFace *)local_58);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }